

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

char * despot::util::tinyxml::TiXmlBase::SkipWhiteSpace(char *p,TiXmlEncoding encoding)

{
  long lVar1;
  bool bVar2;
  char c;
  long lVar3;
  
  if ((p == (char *)0x0) || (c = *p, c == '\0')) {
    p = (char *)0x0;
  }
  else {
    if (encoding == TIXML_ENCODING_UTF8) {
      lVar1 = 1;
      do {
        if (c == -0x11) {
          lVar3 = 3;
          if (p[1] != -0x41) {
            if (p[1] == -0x45) goto LAB_001799f4;
            goto LAB_001799fd;
          }
          if (p[2] != -0x42) {
LAB_001799f4:
            if (p[2] != -0x41) goto LAB_001799fd;
          }
        }
        else {
          if (c == '\0') {
            return p;
          }
LAB_001799fd:
          bVar2 = IsWhiteSpace(c);
          lVar3 = lVar1;
          if (((!bVar2) && (*p != '\n')) && (*p != '\r')) {
            return p;
          }
        }
        c = p[lVar3];
        p = p + lVar3;
      } while( true );
    }
    for (; (c != '\0' && (((bVar2 = IsWhiteSpace(c), bVar2 || (*p == '\r')) || (*p == '\n'))));
        p = p + 1) {
      c = p[1];
    }
  }
  return p;
}

Assistant:

const char* TiXmlBase::SkipWhiteSpace(const char* p, TiXmlEncoding encoding) {
	if (!p || !*p) {
		return 0;
	}
	if (encoding == TIXML_ENCODING_UTF8) {
		while (*p) {
			const unsigned char* pU = (const unsigned char*) p;

			// Skip the stupid Microsoft UTF-8 Byte order marks
			if (*(pU + 0) == TIXML_UTF_LEAD_0 && *(pU + 1) == TIXML_UTF_LEAD_1
				&& *(pU + 2) == TIXML_UTF_LEAD_2) {
				p += 3;
				continue;
			} else if (*(pU + 0) == TIXML_UTF_LEAD_0 && *(pU + 1) == 0xbfU
				&& *(pU + 2) == 0xbeU) {
				p += 3;
				continue;
			} else if (*(pU + 0) == TIXML_UTF_LEAD_0 && *(pU + 1) == 0xbfU
				&& *(pU + 2) == 0xbfU) {
				p += 3;
				continue;
			}

			if (IsWhiteSpace(*p) || *p == '\n' || *p == '\r') // Still using old rules for white space.
				++p;
			else
				break;
		}
	} else {
		while (*p && (IsWhiteSpace(*p) || *p == '\n' || *p == '\r'))
			++p;
	}

	return p;
}